

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::mergeQualifiers
          (TParseContext *this,TSourceLoc *loc,TQualifier *dst,TQualifier *src,bool force)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  TSpirvDecorate *this_00;
  TSpirvDecorate *this_01;
  byte local_13a;
  byte local_139;
  byte local_138;
  byte local_137;
  byte local_136;
  byte local_135;
  byte local_134;
  byte local_133;
  byte local_132;
  byte local_131;
  byte local_130;
  byte local_12f;
  byte local_12e;
  byte local_12d;
  byte local_12c;
  byte local_12b;
  byte local_12a;
  byte local_129;
  byte local_128;
  byte local_127;
  byte local_126;
  byte local_125;
  byte local_124;
  byte local_123;
  byte local_122;
  byte local_121;
  _Self local_f0;
  _Self local_e8;
  reference local_e0;
  pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *decorateString;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  TMap<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>_> *__range3_2;
  _Self local_b0;
  _Self local_a8;
  reference local_a0;
  pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_> *decorateId;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  TMap<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>_> *__range3_1;
  _Self local_70;
  _Self local_68;
  reference local_60;
  pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *decorate;
  const_iterator __end3;
  const_iterator __begin3;
  TMap<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>_> *__range3;
  TSpirvDecorate *dstSpirvDecorate;
  TSpirvDecorate *srcSpirvDecorate;
  bool repeated;
  bool force_local;
  TQualifier *src_local;
  TQualifier *dst_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  bVar1 = TQualifier::isAuxiliary(src);
  if ((bVar1) && (bVar1 = TQualifier::isAuxiliary(dst), bVar1)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only have one auxiliary qualifier (centroid, patch, and sample)");
  }
  bVar1 = TQualifier::isInterpolation(src);
  if ((bVar1) && (bVar1 = TQualifier::isInterpolation(dst), bVar1)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "can only have one interpolation qualifier (flat, smooth, noperspective, __explicitInterpAMD)"
              );
  }
  if ((!force) &&
     ((((bVar1 = TParseVersions::isEsProfile((TParseVersions *)this), !bVar1 &&
        ((this->super_TParseContextBase).super_TParseVersions.version < 0x1a4)) ||
       ((bVar1 = TParseVersions::isEsProfile((TParseVersions *)this), bVar1 &&
        ((this->super_TParseContextBase).super_TParseVersions.version < 0x136)))) &&
      (uVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                         (this,"GL_ARB_shading_language_420pack"), (uVar2 & 1) == 0)))) {
    bVar1 = TQualifier::isNoContraction(src);
    if ((bVar1) &&
       (((((*(ulong *)&dst->field_0x8 >> 0x1c & 1) != 0 ||
          (bVar1 = TQualifier::isInterpolation(dst), bVar1)) ||
         (bVar1 = TQualifier::isAuxiliary(dst), bVar1)) ||
        (((*(ulong *)&dst->field_0x8 & 0x7f) != 0 || ((*(ulong *)&dst->field_0x8 >> 0x19 & 7) != 0))
        )))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"precise qualifier must appear first");
    }
    if (((*(ulong *)&src->field_0x8 >> 0x1c & 1) == 0) ||
       (((bVar1 = TQualifier::isInterpolation(dst), !bVar1 &&
         (bVar1 = TQualifier::isAuxiliary(dst), !bVar1)) &&
        (((*(ulong *)&dst->field_0x8 & 0x7f) == 0 && ((*(ulong *)&dst->field_0x8 >> 0x19 & 7) == 0))
        )))) {
      bVar1 = TQualifier::isInterpolation(src);
      if ((bVar1) &&
         (((bVar1 = TQualifier::isAuxiliary(dst), bVar1 || ((*(ulong *)&dst->field_0x8 & 0x7f) != 0)
           ) || ((*(ulong *)&dst->field_0x8 >> 0x19 & 7) != 0)))) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "interpolation qualifiers must appear before storage and precision qualifiers");
      }
      else {
        bVar1 = TQualifier::isAuxiliary(src);
        if ((bVar1) &&
           (((*(ulong *)&dst->field_0x8 & 0x7f) != 0 ||
            ((*(ulong *)&dst->field_0x8 >> 0x19 & 7) != 0)))) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,
                     "Auxiliary qualifiers (centroid, patch, and sample) must appear before storage and precision qualifiers"
                    );
        }
        else if (((*(ulong *)&src->field_0x8 & 0x7f) != 0) &&
                ((*(ulong *)&dst->field_0x8 >> 0x19 & 7) != 0)) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"precision qualifier must appear as last qualifier");
        }
      }
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "invariant qualifier must appear before interpolation, storage, and precision qualifiers "
                );
    }
    bVar1 = TQualifier::isNoContraction(src);
    if ((bVar1) &&
       (((((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 2 ||
         (((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 0x10)) ||
        (((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 0x11)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"precise qualifier must appear first");
    }
    if ((((uint)*(undefined8 *)&src->field_0x8 & 0x7f) == 2) &&
       ((((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 0x10 ||
        (((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 0x11)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"in/out must appear before const");
    }
  }
  if (((*(ulong *)&dst->field_0x8 & 0x7f) == 0) ||
     (((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 1)) {
    *(ulong *)&dst->field_0x8 =
         *(ulong *)&dst->field_0x8 & 0xffffffffffffff80 |
         (ulong)((uint)*(undefined8 *)&src->field_0x8 & 0x7f);
  }
  else if (((((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 0x10) &&
           (((uint)*(undefined8 *)&src->field_0x8 & 0x7f) == 0x11)) ||
          ((((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 0x11 &&
           (((uint)*(undefined8 *)&src->field_0x8 & 0x7f) == 0x10)))) {
    *(ulong *)&dst->field_0x8 = *(ulong *)&dst->field_0x8 & 0xffffffffffffff80 | 0x12;
  }
  else if (((((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 0x10) &&
           (((uint)*(undefined8 *)&src->field_0x8 & 0x7f) == 2)) ||
          ((((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 2 &&
           (((uint)*(undefined8 *)&src->field_0x8 & 0x7f) == 0x10)))) {
    *(ulong *)&dst->field_0x8 = *(ulong *)&dst->field_0x8 & 0xffffffffffffff80 | 0x13;
  }
  else if (((*(ulong *)&src->field_0x8 & 0x7f) != 0) &&
          (((uint)*(undefined8 *)&src->field_0x8 & 0x7f) != 1)) {
    pcVar3 = GetStorageQualifierString((TStorageQualifier)*(undefined8 *)&src->field_0x8 & 0x7f);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"too many storage qualifiers",pcVar3,"");
  }
  if (((!force) && ((*(ulong *)&src->field_0x8 >> 0x19 & 7) != 0)) &&
     ((*(ulong *)&dst->field_0x8 >> 0x19 & 7) != 0)) {
    pcVar3 = GetPrecisionQualifierString
                       ((TPrecisionQualifier)(*(ulong *)&src->field_0x8 >> 0x19) & 7);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"only one precision qualifier allowed",pcVar3,"");
  }
  if (((*(ulong *)&dst->field_0x8 >> 0x19 & 7) == 0) ||
     ((force && ((*(ulong *)&src->field_0x8 >> 0x19 & 7) != 0)))) {
    *(ulong *)&dst->field_0x8 =
         *(ulong *)&dst->field_0x8 & 0xfffffffff1ffffff |
         (ulong)((uint)(*(ulong *)&src->field_0x8 >> 0x19) & 7) << 0x19;
  }
  if ((!force) &&
     (((((((*(ulong *)&src->field_0x8 >> 0x31 & 1) != 0 &&
          ((((*(ulong *)&dst->field_0x8 >> 0x34 & 1) != 0 ||
            ((*(ulong *)&dst->field_0x8 >> 0x35 & 1) != 0)) ||
           (((*(ulong *)&dst->field_0x8 >> 0x36 & 1) != 0 ||
            (((*(ulong *)&dst->field_0x8 >> 0x37 & 1) != 0 ||
             ((*(ulong *)&dst->field_0x8 >> 0x38 & 1) != 0)))))))) ||
         (((*(ulong *)&src->field_0x8 >> 0x34 & 1) != 0 &&
          (((((*(ulong *)&dst->field_0x8 >> 0x31 & 1) != 0 ||
             ((*(ulong *)&dst->field_0x8 >> 0x35 & 1) != 0)) ||
            ((*(ulong *)&dst->field_0x8 >> 0x36 & 1) != 0)) ||
           (((*(ulong *)&dst->field_0x8 >> 0x37 & 1) != 0 ||
            ((*(ulong *)&dst->field_0x8 >> 0x38 & 1) != 0)))))))) ||
        (((*(ulong *)&src->field_0x8 >> 0x35 & 1) != 0 &&
         ((((*(ulong *)&dst->field_0x8 >> 0x31 & 1) != 0 ||
           ((*(ulong *)&dst->field_0x8 >> 0x34 & 1) != 0)) ||
          (((*(ulong *)&dst->field_0x8 >> 0x36 & 1) != 0 ||
           (((*(ulong *)&dst->field_0x8 >> 0x37 & 1) != 0 ||
            ((*(ulong *)&dst->field_0x8 >> 0x38 & 1) != 0)))))))))) ||
       ((((*(ulong *)&src->field_0x8 >> 0x36 & 1) != 0 &&
         (((((*(ulong *)&dst->field_0x8 >> 0x31 & 1) != 0 ||
            ((*(ulong *)&dst->field_0x8 >> 0x34 & 1) != 0)) ||
           ((*(ulong *)&dst->field_0x8 >> 0x35 & 1) != 0)) ||
          (((*(ulong *)&dst->field_0x8 >> 0x37 & 1) != 0 ||
           ((*(ulong *)&dst->field_0x8 >> 0x38 & 1) != 0)))))) ||
        (((*(ulong *)&src->field_0x8 >> 0x37 & 1) != 0 &&
         ((((*(ulong *)&dst->field_0x8 >> 0x31 & 1) != 0 ||
           ((*(ulong *)&dst->field_0x8 >> 0x34 & 1) != 0)) ||
          (((*(ulong *)&dst->field_0x8 >> 0x35 & 1) != 0 ||
           (((*(ulong *)&dst->field_0x8 >> 0x36 & 1) != 0 ||
            ((*(ulong *)&dst->field_0x8 >> 0x38 & 1) != 0)))))))))))) ||
      (((*(ulong *)&src->field_0x8 >> 0x38 & 1) != 0 &&
       (((((*(ulong *)&dst->field_0x8 >> 0x31 & 1) != 0 ||
          ((*(ulong *)&dst->field_0x8 >> 0x34 & 1) != 0)) ||
         ((*(ulong *)&dst->field_0x8 >> 0x35 & 1) != 0)) ||
        (((*(ulong *)&dst->field_0x8 >> 0x36 & 1) != 0 ||
         ((*(ulong *)&dst->field_0x8 >> 0x37 & 1) != 0)))))))))) {
    pcVar3 = GetPrecisionQualifierString
                       ((TPrecisionQualifier)(*(ulong *)&src->field_0x8 >> 0x19) & 7);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "only one coherent/devicecoherent/queuefamilycoherent/workgroupcoherent/subgroupcoherent/shadercallcoherent qualifier allowed"
               ,pcVar3,"");
  }
  mergeObjectLayoutQualifiers(this,dst,src,false);
  local_121 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x1c & 1) != 0) {
    local_121 = (byte)(*(ulong *)&src->field_0x8 >> 0x1c) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffffefffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x1c & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x1c & 1) != 0) << 0x1c;
  local_122 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x1d & 1) != 0) {
    local_122 = (byte)(*(ulong *)&src->field_0x8 >> 0x1d) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffffdfffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x1d & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x1d & 1) != 0) << 0x1d;
  local_123 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x1e & 1) != 0) {
    local_123 = (byte)(*(ulong *)&src->field_0x8 >> 0x1e) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffffbfffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x1e & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x1e & 1) != 0) << 0x1e;
  local_124 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x1f & 1) != 0) {
    local_124 = (byte)(*(ulong *)&src->field_0x8 >> 0x1f) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffff7fffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x1f & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x1f & 1) != 0) << 0x1f;
  local_125 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x20 & 1) != 0) {
    local_125 = (byte)((ulong)*(undefined8 *)&src->field_0x8 >> 0x20) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffffffeffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 & 0x100000000) != 0 ||
              (*(ulong *)&src->field_0x8 & 0x100000000) != 0) << 0x20;
  local_126 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x24 & 1) != 0) {
    local_126 = (byte)(*(ulong *)&src->field_0x8 >> 0x24) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffefffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x24 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x24 & 1) != 0) << 0x24;
  local_127 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x25 & 1) != 0) {
    local_127 = (byte)(*(ulong *)&src->field_0x8 >> 0x25) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffdfffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x25 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x25 & 1) != 0) << 0x25;
  local_128 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x26 & 1) != 0) {
    local_128 = (byte)(*(ulong *)&src->field_0x8 >> 0x26) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffbfffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x26 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x26 & 1) != 0) << 0x26;
  local_129 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x29 & 1) != 0) {
    local_129 = (byte)(*(ulong *)&src->field_0x8 >> 0x29) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffffdffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x29 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x29 & 1) != 0) << 0x29;
  local_12a = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x2a & 1) != 0) {
    local_12a = (byte)(*(ulong *)&src->field_0x8 >> 0x2a) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffffbffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x2a & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x2a & 1) != 0) << 0x2a;
  local_12b = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x2b & 1) != 0) {
    local_12b = (byte)(*(ulong *)&src->field_0x8 >> 0x2b) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffff7ffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x2b & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x2b & 1) != 0) << 0x2b;
  local_12c = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x2c & 1) != 0) {
    local_12c = (byte)(*(ulong *)&src->field_0x8 >> 0x2c) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffefffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x2c & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x2c & 1) != 0) << 0x2c;
  local_12d = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x2d & 1) != 0) {
    local_12d = (byte)(*(ulong *)&src->field_0x8 >> 0x2d) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffdfffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x2d & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x2d & 1) != 0) << 0x2d;
  local_12e = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x31 & 1) != 0) {
    local_12e = (byte)(*(ulong *)&src->field_0x8 >> 0x31) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffdffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x31 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x31 & 1) != 0) << 0x31;
  local_12f = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x34 & 1) != 0) {
    local_12f = (byte)(*(ulong *)&src->field_0x8 >> 0x34) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffefffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x34 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x34 & 1) != 0) << 0x34;
  local_130 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x35 & 1) != 0) {
    local_130 = (byte)(*(ulong *)&src->field_0x8 >> 0x35) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffdfffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x35 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x35 & 1) != 0) << 0x35;
  local_131 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x36 & 1) != 0) {
    local_131 = (byte)(*(ulong *)&src->field_0x8 >> 0x36) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffbfffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x36 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x36 & 1) != 0) << 0x36;
  local_132 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x37 & 1) != 0) {
    local_132 = (byte)(*(ulong *)&src->field_0x8 >> 0x37) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xff7fffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x37 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x37 & 1) != 0) << 0x37;
  local_133 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x38 & 1) != 0) {
    local_133 = (byte)((ulong)*(undefined8 *)&src->field_0x8 >> 0x38) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfeffffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 & 0x100000000000000) != 0 ||
              (*(ulong *)&src->field_0x8 & 0x100000000000000) != 0) << 0x38;
  local_134 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x39 & 1) != 0) {
    local_134 = (byte)((ulong)*(undefined8 *)&src->field_0x8 >> 0x39) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfdffffffffffffff |
       (ulong)(((byte)((ulong)*(undefined8 *)&dst->field_0x8 >> 0x39) & 1) != 0 ||
              ((byte)((ulong)*(undefined8 *)&src->field_0x8 >> 0x39) & 1) != 0) << 0x39;
  local_135 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x32 & 1) != 0) {
    local_135 = (byte)(*(ulong *)&src->field_0x8 >> 0x32) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffbffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x32 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x32 & 1) != 0) << 0x32;
  local_136 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x33 & 1) != 0) {
    local_136 = (byte)(*(ulong *)&src->field_0x8 >> 0x33) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfff7ffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x33 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x33 & 1) != 0) << 0x33;
  local_137 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x2e & 1) != 0) {
    local_137 = (byte)(*(ulong *)&src->field_0x8 >> 0x2e) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffbfffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x2e & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x2e & 1) != 0) << 0x2e;
  local_138 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x2f & 1) != 0) {
    local_138 = (byte)(*(ulong *)&src->field_0x8 >> 0x2f) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffff7fffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x2f & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x2f & 1) != 0) << 0x2f;
  local_139 = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x30 & 1) != 0) {
    local_139 = (byte)((ulong)*(undefined8 *)&src->field_0x8 >> 0x30) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffeffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 & 0x1000000000000) != 0 ||
              (*(ulong *)&src->field_0x8 & 0x1000000000000) != 0) << 0x30;
  local_13a = 0;
  if ((*(ulong *)&dst->field_0x8 >> 0x21 & 1) != 0) {
    local_13a = (byte)(*(ulong *)&src->field_0x8 >> 0x21) & 1;
  }
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffffffdffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x21 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x21 & 1) != 0) << 0x21;
  dst->spirvStorageClass = src->spirvStorageClass;
  bVar1 = TQualifier::hasSpirvDecorate(src);
  if (bVar1) {
    bVar1 = TQualifier::hasSpirvDecorate(dst);
    if (bVar1) {
      this_00 = TQualifier::getSpirvDecorate(src);
      this_01 = TQualifier::getSpirvDecorate(dst);
      __end3 = std::
               map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
               ::begin((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                        *)this_00);
      decorate = (pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
                 std::
                 map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 ::end((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                        *)this_00);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&decorate), bVar1) {
        local_60 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>
                   ::operator*(&__end3);
        local_68._M_node =
             (_Base_ptr)
             std::
             map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
             ::find((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                     *)this_01,&local_60->first);
        local_70._M_node =
             (_Base_ptr)
             std::
             map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
             ::end((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                    *)this_01);
        bVar1 = std::operator!=(&local_68,&local_70);
        if (bVar1) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate",
                     "(decoration=%u)",(ulong)(uint)local_60->first);
        }
        else {
          std::
          map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
          ::insert((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                    *)this_01,local_60);
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>
        ::operator++(&__end3);
      }
      __end3_1 = std::
                 map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                 ::begin(&(this_00->decorateIds).
                          super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                        );
      decorateId = (pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_> *)
                   std::
                   map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                   ::end(&(this_00->decorateIds).
                          super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                        );
      while (bVar1 = std::operator!=(&__end3_1,(_Self *)&decorateId), bVar1) {
        local_a0 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>
                   ::operator*(&__end3_1);
        local_a8._M_node =
             (_Base_ptr)
             std::
             map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
             ::find(&(this_01->decorateIds).
                     super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                    ,&local_a0->first);
        local_b0._M_node =
             (_Base_ptr)
             std::
             map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
             ::end(&(this_01->decorateIds).
                    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                  );
        bVar1 = std::operator!=(&local_a8,&local_b0);
        if (bVar1) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate_id",
                     "(decoration=%u)",(ulong)(uint)local_a0->first);
        }
        else {
          std::
          map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
          ::insert(&(this_01->decorateIds).
                    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                   ,local_a0);
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>
        ::operator++(&__end3_1);
      }
      __end3_2 = std::
                 map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 ::begin(&(this_00->decorateStrings).
                          super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                        );
      decorateString =
           (pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
           std::
           map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
           ::end(&(this_00->decorateStrings).
                  super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                );
      while (bVar1 = std::operator!=(&__end3_2,(_Self *)&decorateString), bVar1) {
        local_e0 = std::
                   _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>
                   ::operator*(&__end3_2);
        local_e8._M_node =
             (_Base_ptr)
             std::
             map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
             ::find((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                     *)this_01,&local_e0->first);
        local_f0._M_node =
             (_Base_ptr)
             std::
             map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
             ::end((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                    *)this_01);
        bVar1 = std::operator!=(&local_e8,&local_f0);
        if (bVar1) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate_string",
                     "(decoration=%u)",(ulong)(uint)local_e0->first);
        }
        else {
          std::
          map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
          ::insert(&(this_01->decorateStrings).
                    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                   ,local_e0);
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>
        ::operator++(&__end3_2);
      }
    }
    else {
      dst->spirvDecorate = src->spirvDecorate;
    }
  }
  if (((((((((((((((((((((((((local_121 != 0 || local_122 != 0) || local_123 != 0) || local_124 != 0
                           ) || local_125 != 0) || local_126 != 0) || local_127 != 0) ||
                       local_128 != 0) || local_129 != 0) || local_12a != 0) || local_12b != 0) ||
                   local_12c != 0) || local_12d != 0) || local_12e != 0) || local_12f != 0) ||
               local_130 != 0) || local_131 != 0) || local_132 != 0) || local_133 != 0) ||
           local_134 != 0) || local_135 != 0) || local_136 != 0) || local_137 != 0) ||
       local_138 != 0) || local_139 != 0) || local_13a != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"replicated qualifiers","");
  }
  return;
}

Assistant:

void TParseContext::mergeQualifiers(const TSourceLoc& loc, TQualifier& dst, const TQualifier& src, bool force)
{
    // Multiple auxiliary qualifiers (mostly done later by 'individual qualifiers')
    if (src.isAuxiliary() && dst.isAuxiliary())
        error(loc, "can only have one auxiliary qualifier (centroid, patch, and sample)", "", "");

    // Multiple interpolation qualifiers (mostly done later by 'individual qualifiers')
    if (src.isInterpolation() && dst.isInterpolation())
        error(loc, "can only have one interpolation qualifier (flat, smooth, noperspective, __explicitInterpAMD)", "", "");

    // Ordering
    if (! force && ((!isEsProfile() && version < 420) ||
                    (isEsProfile() && version < 310))
                && ! extensionTurnedOn(E_GL_ARB_shading_language_420pack)) {
        // non-function parameters
        if (src.isNoContraction() && (dst.invariant || dst.isInterpolation() || dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "precise qualifier must appear first", "", "");
        if (src.invariant && (dst.isInterpolation() || dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "invariant qualifier must appear before interpolation, storage, and precision qualifiers ", "", "");
        else if (src.isInterpolation() && (dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "interpolation qualifiers must appear before storage and precision qualifiers", "", "");
        else if (src.isAuxiliary() && (dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "Auxiliary qualifiers (centroid, patch, and sample) must appear before storage and precision qualifiers", "", "");
        else if (src.storage != EvqTemporary && (dst.precision != EpqNone))
            error(loc, "precision qualifier must appear as last qualifier", "", "");

        // function parameters
        if (src.isNoContraction() && (dst.storage == EvqConst || dst.storage == EvqIn || dst.storage == EvqOut))
            error(loc, "precise qualifier must appear first", "", "");
        if (src.storage == EvqConst && (dst.storage == EvqIn || dst.storage == EvqOut))
            error(loc, "in/out must appear before const", "", "");
    }

    // Storage qualification
    if (dst.storage == EvqTemporary || dst.storage == EvqGlobal)
        dst.storage = src.storage;
    else if ((dst.storage == EvqIn  && src.storage == EvqOut) ||
             (dst.storage == EvqOut && src.storage == EvqIn))
        dst.storage = EvqInOut;
    else if ((dst.storage == EvqIn    && src.storage == EvqConst) ||
             (dst.storage == EvqConst && src.storage == EvqIn))
        dst.storage = EvqConstReadOnly;
    else if (src.storage != EvqTemporary &&
             src.storage != EvqGlobal)
        error(loc, "too many storage qualifiers", GetStorageQualifierString(src.storage), "");

    // Precision qualifiers
    if (! force && src.precision != EpqNone && dst.precision != EpqNone)
        error(loc, "only one precision qualifier allowed", GetPrecisionQualifierString(src.precision), "");
    if (dst.precision == EpqNone || (force && src.precision != EpqNone))
        dst.precision = src.precision;

    if (!force && ((src.coherent && (dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.devicecoherent && (dst.coherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.queuefamilycoherent && (dst.coherent || dst.devicecoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.workgroupcoherent && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.subgroupcoherent  && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.shadercallcoherent)) ||
                   (src.shadercallcoherent && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent)))) {
        error(loc, "only one coherent/devicecoherent/queuefamilycoherent/workgroupcoherent/subgroupcoherent/shadercallcoherent qualifier allowed",
            GetPrecisionQualifierString(src.precision), "");
    }

    // Layout qualifiers
    mergeObjectLayoutQualifiers(dst, src, false);

    // individual qualifiers
    bool repeated = false;
    #define MERGE_SINGLETON(field) repeated |= dst.field && src.field; dst.field |= src.field;
    MERGE_SINGLETON(invariant);
    MERGE_SINGLETON(centroid);
    MERGE_SINGLETON(smooth);
    MERGE_SINGLETON(flat);
    MERGE_SINGLETON(specConstant);
    MERGE_SINGLETON(noContraction);
    MERGE_SINGLETON(nopersp);
    MERGE_SINGLETON(explicitInterp);
    MERGE_SINGLETON(perPrimitiveNV);
    MERGE_SINGLETON(perViewNV);
    MERGE_SINGLETON(perTaskNV);
    MERGE_SINGLETON(patch);
    MERGE_SINGLETON(sample);
    MERGE_SINGLETON(coherent);
    MERGE_SINGLETON(devicecoherent);
    MERGE_SINGLETON(queuefamilycoherent);
    MERGE_SINGLETON(workgroupcoherent);
    MERGE_SINGLETON(subgroupcoherent);
    MERGE_SINGLETON(shadercallcoherent);
    MERGE_SINGLETON(nonprivate);
    MERGE_SINGLETON(volatil);
    MERGE_SINGLETON(nontemporal);
    MERGE_SINGLETON(restrict);
    MERGE_SINGLETON(readonly);
    MERGE_SINGLETON(writeonly);
    MERGE_SINGLETON(nonUniform);

    // SPIR-V storage class qualifier (GL_EXT_spirv_intrinsics)
    dst.spirvStorageClass = src.spirvStorageClass;

    // SPIR-V decorate qualifiers (GL_EXT_spirv_intrinsics)
    if (src.hasSpirvDecorate()) {
        if (dst.hasSpirvDecorate()) {
            const TSpirvDecorate& srcSpirvDecorate = src.getSpirvDecorate();
            TSpirvDecorate& dstSpirvDecorate = dst.getSpirvDecorate();
            for (auto& decorate : srcSpirvDecorate.decorates) {
                if (dstSpirvDecorate.decorates.find(decorate.first) != dstSpirvDecorate.decorates.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate", "(decoration=%u)", decorate.first);
                else
                    dstSpirvDecorate.decorates.insert(decorate);
            }

            for (auto& decorateId : srcSpirvDecorate.decorateIds) {
                if (dstSpirvDecorate.decorateIds.find(decorateId.first) != dstSpirvDecorate.decorateIds.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate_id", "(decoration=%u)", decorateId.first);
                else
                    dstSpirvDecorate.decorateIds.insert(decorateId);
            }

            for (auto& decorateString : srcSpirvDecorate.decorateStrings) {
                if (dstSpirvDecorate.decorates.find(decorateString.first) != dstSpirvDecorate.decorates.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate_string", "(decoration=%u)", decorateString.first);
                else
                    dstSpirvDecorate.decorateStrings.insert(decorateString);
            }
        } else {
            dst.spirvDecorate = src.spirvDecorate;
        }
    }

    if (repeated)
        error(loc, "replicated qualifiers", "", "");
}